

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

LazyObject * __thiscall Assimp::STEP::DB::GetObject(DB *this,string *type)

{
  const_iterator cVar1;
  LazyObject *pLVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
          ::find(&(this->objects_bytype)._M_t,type);
  if (((_Rb_tree_header *)cVar1._M_node ==
       &(this->objects_bytype)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar1._M_node[3]._M_parent == (_Base_ptr)0x0)) {
    pLVar2 = (LazyObject *)0x0;
  }
  else {
    pLVar2 = *(LazyObject **)(cVar1._M_node[2]._M_right + 1);
  }
  return pLVar2;
}

Assistant:

const LazyObject* GetObject(const std::string& type) const {
            const ObjectMapByType::const_iterator it = objects_bytype.find(type);
            if (it != objects_bytype.end() && (*it).second.size()) {
                return *(*it).second.begin();
            }
            return NULL;
        }